

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb_tests.cpp
# Opt level: O3

void __thiscall
wallet::walletdb_tests::walletdb_read_write_deadlock::test_method
          (walletdb_read_write_deadlock *this)

{
  Chain *chain;
  undefined8 uVar1;
  int iVar2;
  size_t sVar3;
  CWallet *this_00;
  LegacyScriptPubKeyMan *pLVar4;
  bilingual_str *error;
  iterator pvVar5;
  iterator in_R9;
  iterator pvVar6;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  check_type cVar7;
  char *local_228;
  char *local_220;
  undefined1 *local_218;
  undefined1 *local_210;
  char *local_208;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  char *local_1d8;
  char *local_1d0;
  long *local_1c8;
  undefined4 local_1bc;
  shared_ptr<wallet::CWallet> wallet;
  undefined1 *local_198;
  undefined1 *local_190;
  char *local_188;
  char *local_180;
  long *local_178;
  DatabaseStatus status;
  undefined4 *local_168;
  DatabaseStatus *local_160;
  char *local_158;
  char *local_150;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock6;
  shared_count sStack_138;
  path local_130;
  undefined1 local_108 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  bilingual_str error_string;
  DatabaseOptions local_a0;
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_a0.create_passphrase._M_dataplus._M_p = (pointer)&local_a0.create_passphrase.field_2;
  error_string.original._M_dataplus._M_p = (pointer)&error_string.original.field_2;
  error_string.translated._M_dataplus._M_p = (pointer)&error_string.translated.field_2;
  local_a0.require_existing = false;
  local_a0.require_create = false;
  local_a0.create_flags = 0;
  local_a0.create_passphrase._M_string_length = 0;
  local_a0.create_passphrase.field_2._M_local_buf[0] = '\0';
  local_a0.verify = true;
  local_a0.use_unsafe_sync = false;
  local_a0.use_shared_memory = false;
  local_a0.max_log_mb = 100;
  local_a0.require_format.super__Optional_base<wallet::DatabaseFormat,_true,_true>._M_payload.
  super__Optional_payload_base<wallet::DatabaseFormat> =
       (_Optional_base<wallet::DatabaseFormat,_true,_true>)
       (_Optional_payload<wallet::DatabaseFormat,_true,_true,_true>)0x100000001;
  error_string.original._M_string_length = 0;
  error_string.original.field_2._M_local_buf[0] = '\0';
  error_string.translated._M_string_length = 0;
  error_string.translated.field_2._M_local_buf[0] = '\0';
  std::filesystem::__cxx11::path::path
            (&local_130,&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_path_root.super_path);
  tinyformat::format<wallet::DatabaseFormat>((string *)local_58,"wallet_%d_.dat",&DATABASE_FORMATS);
  uVar1 = local_58._0_8_;
  sVar3 = strlen((char *)local_58._0_8_);
  std::filesystem::__cxx11::path::_M_append(&local_130,sVar3,uVar1);
  std::filesystem::__cxx11::path::path((path *)local_108,&local_130);
  error = &error_string;
  MakeDatabase((wallet *)&local_178,(path *)local_108,&local_a0,&status,error);
  std::filesystem::__cxx11::path::~path((path *)local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &aStack_48) {
    operator_delete((void *)local_58._0_8_,aStack_48._M_allocated_capacity + 1);
  }
  std::filesystem::__cxx11::path::~path(&local_130);
  local_188 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/walletdb_tests.cpp"
  ;
  local_180 = "";
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x2a;
  file.m_begin = (iterator)&local_188;
  msg.m_end = in_R9;
  msg.m_begin = (iterator)error;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_198,msg);
  wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_1_ = 0
  ;
  wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&PTR__lazy_ostream_01388f08;
  criticalblock6.super_unique_lock._M_device =
       (mutex_type *)CONCAT71(criticalblock6.super_unique_lock._M_device._1_7_,status == SUCCESS);
  local_168 = &local_1bc;
  local_1bc = 0;
  criticalblock6.super_unique_lock._M_owns = false;
  criticalblock6.super_unique_lock._9_7_ = 0;
  sStack_138.pi_ = (sp_counted_base *)0x0;
  local_158 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/walletdb_tests.cpp"
  ;
  local_150 = "";
  local_f8._8_8_ = &local_160;
  local_108[8] = false;
  local_108._0_8_ = &PTR__lazy_ostream_01390398;
  local_f8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = &local_168;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_01390398;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_160 = &status;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&criticalblock6,(lazy_ostream *)&wallet,1,2,REQUIRE,0xfa873b,
             (size_t)&local_158,0x2a,(path *)local_108,"DatabaseStatus::SUCCESS",local_58);
  boost::detail::shared_count::~shared_count(&sStack_138);
  this_00 = (CWallet *)operator_new(0x4a8);
  chain = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_node.chain._M_t.
          super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t.
          super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
          super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
  local_108._0_8_ = &local_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"");
  local_1c8 = local_178;
  local_178 = (long *)0x0;
  CWallet::CWallet(this_00,chain,(string *)local_108,
                   (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                   )&local_1c8);
  wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<wallet::CWallet*>
            (&wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             this_00);
  if (local_1c8 != (long *)0x0) {
    (**(code **)(*local_1c8 + 8))();
  }
  local_1c8 = (long *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._0_8_ != &local_f8) {
    operator_delete((void *)local_108._0_8_,(ulong)(local_f8._M_allocated_capacity + 1));
  }
  (wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_keypool_size =
       4;
  criticalblock6.super_unique_lock._M_device =
       &((wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->cs_wallet)
        .super_recursive_mutex;
  criticalblock6.super_unique_lock._8_8_ =
       criticalblock6.super_unique_lock._8_8_ & 0xffffffffffffff00;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock6.super_unique_lock);
  pLVar4 = CWallet::GetOrCreateLegacyScriptPubKeyMan
                     (wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ;
  local_1d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/walletdb_tests.cpp"
  ;
  local_1d0 = "";
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x32;
  file_00.m_begin = (iterator)&local_1d8;
  msg_00.m_end = pvVar6;
  msg_00.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1e8,
             msg_00);
  _cVar7 = 0x81a81d;
  iVar2 = (*(pLVar4->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0xb])
                    (pLVar4,1);
  local_58._8_8_ = (element_type *)0x0;
  aStack_48._M_allocated_capacity = 0;
  local_158 = "legacy_spkm->SetupGeneration(true)";
  local_150 = "";
  local_108[8] = false;
  local_108._0_8_ = &PTR__lazy_ostream_01389048;
  local_f8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_f8._8_8_ = &local_158;
  local_1f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/walletdb_tests.cpp"
  ;
  local_1f0 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_58[0] = (class_property<bool>)(bool)SUB41(iVar2,0);
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)local_108,1,0,WARN,_cVar7,
             (size_t)&local_1f8,0x32);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity);
  CWallet::Flush(wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  local_208 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/walletdb_tests.cpp"
  ;
  local_200 = "";
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x36;
  file_01.m_begin = (iterator)&local_208;
  msg_01.m_end = pvVar6;
  msg_01.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_218,
             msg_01);
  pLVar4 = CWallet::GetLegacyScriptPubKeyMan
                     (wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ;
  _cVar7 = 0x81a902;
  local_58[0] = (class_property<bool>)LegacyDataSPKM::DeleteRecords(&pLVar4->super_LegacyDataSPKM);
  local_58._8_8_ = (element_type *)0x0;
  aStack_48._M_allocated_capacity = 0;
  local_158 = "wallet->GetLegacyScriptPubKeyMan()->DeleteRecords()";
  local_150 = "";
  local_108[8] = false;
  local_108._0_8_ = &PTR__lazy_ostream_01389048;
  local_f8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_f8._8_8_ = &local_158;
  local_228 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/walletdb_tests.cpp"
  ;
  local_220 = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)local_108,1,0,WARN,_cVar7,
             (size_t)&local_228,0x36);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock6.super_unique_lock);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT71(wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi._1_7_,
               wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi._0_1_) != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT71(wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._1_7_,
                        wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._0_1_));
  }
  if (local_178 != (long *)0x0) {
    (**(code **)(*local_178 + 8))();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)error_string.translated._M_dataplus._M_p != &error_string.translated.field_2) {
    operator_delete(error_string.translated._M_dataplus._M_p,
                    CONCAT71(error_string.translated.field_2._M_allocated_capacity._1_7_,
                             error_string.translated.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)error_string.original._M_dataplus._M_p != &error_string.original.field_2) {
    operator_delete(error_string.original._M_dataplus._M_p,
                    CONCAT71(error_string.original.field_2._M_allocated_capacity._1_7_,
                             error_string.original.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_secure_allocator<char>_>_11
       *)local_a0.create_passphrase._M_dataplus._M_p != &local_a0.create_passphrase.field_2) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_secure_allocator<char>_>::_M_destroy
              (&local_a0.create_passphrase,
               CONCAT71(local_a0.create_passphrase.field_2._M_allocated_capacity._1_7_,
                        local_a0.create_passphrase.field_2._M_local_buf[0]));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(walletdb_read_write_deadlock)
{
    // Exercises a db read write operation that shouldn't deadlock.
    for (const DatabaseFormat& db_format : DATABASE_FORMATS) {
        // Context setup
        DatabaseOptions options;
        options.require_format = db_format;
        DatabaseStatus status;
        bilingual_str error_string;
        std::unique_ptr<WalletDatabase> db = MakeDatabase(m_path_root / strprintf("wallet_%d_.dat", db_format).c_str(), options, status, error_string);
        BOOST_CHECK_EQUAL(status, DatabaseStatus::SUCCESS);

        std::shared_ptr<CWallet> wallet(new CWallet(m_node.chain.get(), "", std::move(db)));
        wallet->m_keypool_size = 4;

        // Create legacy spkm
        LOCK(wallet->cs_wallet);
        auto legacy_spkm = wallet->GetOrCreateLegacyScriptPubKeyMan();
        BOOST_CHECK(legacy_spkm->SetupGeneration(true));
        wallet->Flush();

        // Now delete all records, which performs a read write operation.
        BOOST_CHECK(wallet->GetLegacyScriptPubKeyMan()->DeleteRecords());
    }
}